

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::bitmask<slang::ast::InstanceFlags>&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          DefinitionSymbol *args_3,ParameterBuilder *args_4,
          bitmask<slang::ast::InstanceFlags> *args_5)

{
  string_view name;
  InstanceSymbol *pIVar1;
  SourceLocation in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  bitmask<slang::ast::InstanceFlags> flags;
  InstanceSymbol *in_R9;
  ParameterBuilder *unaff_retaddr;
  size_t in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  flags.m_bits = (underlying_type)((ulong)in_R8 >> 0x38);
  pIVar1 = (InstanceSymbol *)
           allocate(in_stack_ffffffffffffffb8,
                    CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
  name._M_str = in_RSI;
  name._M_len = (size_t)in_RDX;
  slang::ast::InstanceSymbol::InstanceSymbol
            (in_R9,(Compilation *)in_RDX[1],name,in_RCX,(DefinitionSymbol *)*in_RDX,unaff_retaddr,
             flags);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }